

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O2

xmlParserInputPtr testExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = 0;
  uVar5 = (ulong)(uint)nb_entities;
  if (nb_entities < 1) {
    uVar5 = uVar6;
  }
  do {
    uVar7 = uVar6;
    if (uVar5 == uVar7) {
      iVar1 = checkTestFile(URL);
      if (iVar1 == 0) {
        iVar1 = xmlMemUsed();
        pxVar3 = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(URL,ID,ctxt);
        iVar2 = xmlMemUsed();
        extraMemoryFromResolver = extraMemoryFromResolver + (iVar2 - iVar1);
        return pxVar3;
      }
      pxVar3 = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(URL,ID,ctxt);
      return pxVar3;
    }
    iVar1 = strcmp(testEntitiesName[uVar7],URL);
    uVar6 = uVar7 + 1;
  } while (iVar1 != 0);
  pxVar3 = (xmlParserInputPtr)xmlNewStringInputStream(ctxt,testEntitiesName[uVar7 + 0x14]);
  if (pxVar3 == (xmlParserInputPtr)0x0) {
    pxVar3 = (xmlParserInputPtr)0x0;
  }
  else {
    pcVar4 = (char *)xmlStrdup(*(undefined8 *)(&nb_entities + (uVar7 + 1) * 2));
    pxVar3->filename = pcVar4;
  }
  return pxVar3;
}

Assistant:

static xmlParserInputPtr
testExternalEntityLoader(const char *URL, const char *ID,
			 xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr ret;
    int i;

    for (i = 0;i < nb_entities;i++) {
        if (!strcmp(testEntitiesName[i], URL)) {
	    ret = xmlNewStringInputStream(ctxt,
	                (const xmlChar *) testEntitiesValue[i]);
	    if (ret != NULL) {
	        ret->filename = (const char *)
		                xmlStrdup((xmlChar *)testEntitiesName[i]);
	    }
	    return(ret);
	}
    }
    if (checkTestFile(URL)) {
	ret = xmlNoNetExternalEntityLoader(URL, ID, ctxt);
    } else {
	int memused = xmlMemUsed();
	ret = xmlNoNetExternalEntityLoader(URL, ID, ctxt);
	extraMemoryFromResolver += xmlMemUsed() - memused;
    }
#if 0
    if (ret == NULL) {
        fprintf(stderr, "Failed to find resource %s\n", URL);
    }
#endif

    return(ret);
}